

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O0

void bitstream_put_bits(bitstream_t *bs,uint64_t value,uint num_bits)

{
  ulong uVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint local_2c;
  uint bits;
  uint start_bits;
  uint8_t *p;
  uint skip_bits;
  uint num_bits_local;
  uint64_t value_local;
  bitstream_t *bs_local;
  
  uVar1 = bs->position;
  uVar4 = (uint)uVar1 & 7;
  pbVar6 = (bs->buffer).w + (bs->position >> 3);
  bs->position = (ulong)num_bits + bs->position;
  p = pbVar6;
  num_bits_local = num_bits;
  if ((uVar1 & 7) != 0) {
    uVar5 = 8 - uVar4;
    local_2c = uVar5;
    if (num_bits < uVar5) {
      local_2c = num_bits;
    }
    cVar2 = (char)local_2c;
    *pbVar6 = *pbVar6 & ((byte)(0xff << ((byte)uVar5 & 0x1f)) |
                        (byte)(0xff >> ((char)uVar4 + cVar2 & 0x1fU)));
    p = pbVar6 + 1;
    *pbVar6 = *pbVar6 | (byte)((value >> ((char)num_bits - cVar2 & 0x3fU)) <<
                              ((byte)uVar5 - cVar2 & 0x3f));
    num_bits_local = num_bits - local_2c;
  }
  for (; bVar3 = (byte)num_bits_local, 7 < num_bits_local; num_bits_local = num_bits_local - 8) {
    *p = (uint8_t)(value >> (bVar3 - 8 & 0x3f));
    p = p + 1;
  }
  if (num_bits_local != 0) {
    *p = *p & (byte)(0xff >> (bVar3 & 0x1f));
    *p = *p | (byte)((value & (long)((1 << (bVar3 & 0x1f)) + -1)) << (8 - bVar3 & 0x3f));
  }
  return;
}

Assistant:

static inline void bitstream_put_bits(bitstream_t* bs, uint64_t value, unsigned int num_bits) {
  ASSUME(1 <= num_bits && num_bits <= 64);

  const unsigned int skip_bits = bs->position % 8;
  uint8_t* p                   = &bs->buffer.w[bs->position / 8];

  bs->position += num_bits;
  if (skip_bits) {
    // the upper skip_bits of current pos have already been taken
    const unsigned int start_bits = 8 - skip_bits;
    const unsigned int bits       = num_bits < start_bits ? num_bits : start_bits;

    *p &= (0xFF << start_bits) | (0xFF >> (skip_bits + bits)); // clear bits before setting
    *p++ |= (value >> (num_bits - bits)) << (start_bits - bits);
    num_bits -= bits;
  }

  for (; num_bits >= 8; num_bits -= 8, ++p) {
    *p = value >> (num_bits - 8);
  }

  if (num_bits > 0) {
    *p &= (0xFF >> num_bits); // clear bits before setting
    *p |= (value & ((1 << num_bits) - 1)) << (8 - num_bits);
  }
}